

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nestl_test.hpp
# Opt level: O3

void nestl::test::detail::
     print_tuple_impl<char,std::char_traits<char>,std::tuple<char_const*,void*,char_const*>,0ul,1ul,2ul>
               (ostream *os,undefined8 *t)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = (char *)t[2];
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar2);
  }
  std::ostream::_M_insert<void_const*>(os);
  pcVar1 = (char *)*t;
  if (pcVar1 != (char *)0x0) {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar2);
    return;
  }
  std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  return;
}

Assistant:

void print_tuple_impl(std::basic_ostream<Ch, Tr>& os, const Tuple& t, seq<Is...>)
{
    using swallow = int[1 + sizeof...(Is)];
    (void)swallow
    {
        0,
        (void(os << /* (Is == 0 ? "" : ", ") << */ std::get<Is>(t)), 0)...
    };
}